

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.h
# Opt level: O2

bool __thiscall QueryResult::is_empty(QueryResult *this)

{
  if (this->has_everything != false) {
    return false;
  }
  return (this->results).run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish ==
         (this->results).run_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start &&
         (this->results).sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         (this->results).sequence_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool is_empty() const { return !has_everything && results.empty(); }